

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_buffer.h
# Opt level: O1

void __thiscall
PenguinV_Image::ImageTemplate<unsigned_char>::FunctionFacade::FunctionFacade(FunctionFacade *this)

{
  value_type local_30;
  
  (this->_deallocate).
  super__Vector_base<void_(*)(unsigned_char_*),_std::allocator<void_(*)(unsigned_char_*)>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_deallocate).
  super__Vector_base<void_(*)(unsigned_char_*),_std::allocator<void_(*)(unsigned_char_*)>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_copy).
  super__Vector_base<void_(*)(unsigned_char_*,_unsigned_char_*,_unsigned_long),_std::allocator<void_(*)(unsigned_char_*,_unsigned_char_*,_unsigned_long)>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_copy).
  super__Vector_base<void_(*)(unsigned_char_*,_unsigned_char_*,_unsigned_long),_std::allocator<void_(*)(unsigned_char_*,_unsigned_char_*,_unsigned_long)>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_copy).
  super__Vector_base<void_(*)(unsigned_char_*,_unsigned_char_*,_unsigned_long),_std::allocator<void_(*)(unsigned_char_*,_unsigned_char_*,_unsigned_long)>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_set).
  super__Vector_base<void_(*)(unsigned_char_*,_unsigned_char,_unsigned_long),_std::allocator<void_(*)(unsigned_char_*,_unsigned_char,_unsigned_long)>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_set).
  super__Vector_base<void_(*)(unsigned_char_*,_unsigned_char,_unsigned_long),_std::allocator<void_(*)(unsigned_char_*,_unsigned_char,_unsigned_long)>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_set).
  super__Vector_base<void_(*)(unsigned_char_*,_unsigned_char,_unsigned_long),_std::allocator<void_(*)(unsigned_char_*,_unsigned_char,_unsigned_long)>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_allocate).
  super__Vector_base<unsigned_char_*(*)(unsigned_long),_std::allocator<unsigned_char_*(*)(unsigned_long)>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_allocate).
  super__Vector_base<unsigned_char_*(*)(unsigned_long),_std::allocator<unsigned_char_*(*)(unsigned_long)>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_allocate).
  super__Vector_base<unsigned_char_*(*)(unsigned_long),_std::allocator<unsigned_char_*(*)(unsigned_long)>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_deallocate).
  super__Vector_base<void_(*)(unsigned_char_*),_std::allocator<void_(*)(unsigned_char_*)>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_deallocate).
  super__Vector_base<void_(*)(unsigned_char_*),_std::allocator<void_(*)(unsigned_char_*)>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_deallocate).
  super__Vector_base<void_(*)(unsigned_char_*),_std::allocator<void_(*)(unsigned_char_*)>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_copy).
  super__Vector_base<void_(*)(unsigned_char_*,_unsigned_char_*,_unsigned_long),_std::allocator<void_(*)(unsigned_char_*,_unsigned_char_*,_unsigned_long)>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_copy).
  super__Vector_base<void_(*)(unsigned_char_*,_unsigned_char_*,_unsigned_long),_std::allocator<void_(*)(unsigned_char_*,_unsigned_char_*,_unsigned_long)>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_30 = (value_type)0x0;
  std::vector<unsigned_char_*(*)(unsigned_long),_std::allocator<unsigned_char_*(*)(unsigned_long)>_>
  ::resize(&this->_allocate,0x100,(value_type *)&local_30);
  local_30 = (value_type)0x0;
  std::vector<void_(*)(unsigned_char_*),_std::allocator<void_(*)(unsigned_char_*)>_>::resize
            (&this->_deallocate,0x100,(value_type *)&local_30);
  local_30 = (value_type)0x0;
  std::
  vector<void_(*)(unsigned_char_*,_unsigned_char_*,_unsigned_long),_std::allocator<void_(*)(unsigned_char_*,_unsigned_char_*,_unsigned_long)>_>
  ::resize(&this->_copy,0x100,&local_30);
  local_30 = (value_type)0x0;
  std::
  vector<void_(*)(unsigned_char_*,_unsigned_char,_unsigned_long),_std::allocator<void_(*)(unsigned_char_*,_unsigned_char,_unsigned_long)>_>
  ::resize(&this->_set,0x100,(value_type *)&local_30);
  return;
}

Assistant:

FunctionFacade()
            {
                _allocate  .resize( 256, nullptr );
                _deallocate.resize( 256, nullptr );
                _copy      .resize( 256, nullptr );
                _set       .resize( 256, nullptr );
            }